

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerBailOnNotBuiltIn
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *labelBailOut)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int32 n;
  undefined4 *puVar5;
  undefined4 extraout_var;
  Opnd *pOVar6;
  IntConstOpnd *this_00;
  MemRefOpnd *compareSrc2;
  LabelInstr *target;
  Lowerer *this_01;
  BuiltinFunction local_31 [8];
  BuiltinFunction builtInIndex;
  
  bVar3 = IR::Opnd::IsIntConstOpnd(instr->m_src2);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3218,"(instr->GetSrc2()->IsIntConstOpnd())",
                       "instr->GetSrc2()->IsIntConstOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pIVar1 = instr->m_prev;
  iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x1f])();
  pOVar6 = IR::Instr::UnlinkSrc2(instr);
  this_00 = IR::Opnd::AsIntConstOpnd(pOVar6);
  n = IR::IntConstOpnd::AsInt32(this_00);
  Js::BuiltinFunction::BuiltinFunction(local_31,n);
  compareSrc2 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var,iVar4) +
                                            (ulong)local_31[0]._value * 8),TyInt64,instr->m_func,
                                    AddrOpndKindDynamicMisc);
  target = IR::LabelInstr::New(Label,instr->m_func,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  this_01 = (Lowerer *)instr;
  pOVar6 = IR::Instr::UnlinkSrc1(instr);
  InsertCompareBranch(this_01,pOVar6,&compareSrc2->super_Opnd,BrEq_A,target,instr,false);
  GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotBuiltIn(IR::Instr       *instr,
                               IR::BranchInstr *branchInstr  /* = nullptr */,
                               IR::LabelInstr  *labelBailOut /* = nullptr */)
{
    Assert(instr->GetSrc2()->IsIntConstOpnd());
    IR::Instr *prevInstr = instr->m_prev;

    intptr_t builtInFuncs = m_func->GetScriptContextInfo()->GetBuiltinFunctionsBaseAddr();
    Js::BuiltinFunction builtInIndex = instr->UnlinkSrc2()->AsIntConstOpnd()->AsInt32();

    IR::Opnd *builtIn = IR::MemRefOpnd::New((void*)(builtInFuncs + builtInIndex * MachPtr), TyMachReg, instr->m_func);

#if TESTBUILTINFORNULL
    IR::LabelInstr * continueAfterTestLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    InsertTestBranch(builtIn, builtIn, Js::OpCode::BrNeq_A, continueAfterTestLabel, instr);
    this->m_lowererMD.GenerateDebugBreak(instr);
    instr->InsertBefore(continueAfterTestLabel);
#endif

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    instr->InsertAfter(continueLabel);
    InsertCompareBranch(instr->UnlinkSrc1(), builtIn, Js::OpCode::BrEq_A, continueLabel, instr);

    GenerateBailOut(instr, branchInstr, labelBailOut);

    return prevInstr;
}